

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdPerformReplace(char *pBuffer,int PosStart,int Pos,int Symb,char *pNext)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)PosStart;
  if (PosStart < Pos) {
    pcVar2 = Dau_DsdPerformReplace::pTemp;
    lVar6 = lVar5;
    do {
      if (pBuffer[lVar6] == Symb) {
        cVar4 = *pNext;
        pcVar3 = pNext + 1;
        while (cVar4 != '\0') {
          *pcVar2 = cVar4;
          pcVar2 = pcVar2 + 1;
          cVar4 = *pcVar3;
          pcVar3 = pcVar3 + 1;
        }
      }
      else {
        *pcVar2 = pBuffer[lVar6];
        pcVar2 = pcVar2 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != Pos);
  }
  else {
    pcVar2 = Dau_DsdPerformReplace::pTemp;
  }
  iVar1 = (int)pcVar2 + -0xe0c210 + PosStart;
  if (PosStart < iVar1) {
    lVar6 = 0;
    do {
      pBuffer[lVar6 + lVar5] = Dau_DsdPerformReplace::pTemp[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar1 - lVar5 != lVar6);
  }
  return iVar1;
}

Assistant:

static inline int Dau_DsdPerformReplace( char * pBuffer, int PosStart, int Pos, int Symb, char * pNext )
{
    static char pTemp[DAU_MAX_STR];
    char * pCur = pTemp;
    int i, k, RetValue;
    for ( i = PosStart; i < Pos; i++ )
        if ( pBuffer[i] != Symb )
            *pCur++ = pBuffer[i];
        else
            for ( k = 0; pNext[k]; k++ )
                *pCur++ = pNext[k];
    RetValue = PosStart + (pCur - pTemp);
    for ( i = PosStart; i < RetValue; i++ )
        pBuffer[i] = pTemp[i-PosStart];
    return RetValue;
}